

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void kratos::SystemVerilogCodeGen::enum_code_(Stream *stream_,Enum *enum_,bool debug)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  long lVar3;
  long lVar4;
  Enum *pEVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  ulong uVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>_>_>_>
  *this;
  mapped_type *pmVar9;
  undefined7 in_register_00000011;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  undefined8 uVar10;
  _Rb_tree_header *p_Var11;
  size_t sVar12;
  string_view format_str;
  format_args args;
  undefined1 local_a8 [8];
  string logic_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string local_68;
  undefined4 local_44;
  Stream *local_40;
  Enum *local_38;
  Enum *enum__local;
  
  local_44 = (undefined4)CONCAT71(in_register_00000011,debug);
  local_40 = stream_;
  local_38 = enum_;
  if (enum_->width_ == 1) {
    local_a8 = (undefined1  [8])&logic_str._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
  }
  else {
    local_68._M_dataplus._M_p = (pointer)(ulong)(enum_->width_ - 1);
    format_str.size_ = 2;
    format_str.data_ = (char *)0x7;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    fmt::v7::detail::vformat_abi_cxx11_((string *)local_a8,(detail *)"[{0}:0]",format_str,args);
  }
  puVar1 = &(local_40->super_stringstream).field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"typedef enum logic",0x12);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(char *)local_a8,(long)logic_str._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," {",2);
  puVar2 = &(local_40->super_stringstream).field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  local_68._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_68,1);
  logic_str.field_2._8_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&logic_str.field_2 + 8),
            (enum_->values)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var7 = (enum_->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(enum_->values)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var11) {
    do {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (logic_str.field_2._M_local_buf + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var7 + 1));
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var11);
  }
  uVar10 = logic_str.field_2._8_8_;
  if (logic_str.field_2._8_8_ != 0) {
    lVar4 = -logic_str.field_2._8_8_;
    uVar8 = lVar4 >> 5;
    lVar3 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::enum_code_(kratos::Stream&,kratos::Enum*,bool)::__0>>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )logic_str.field_2._8_8_,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )0x0,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:1195:43)>
                )&local_38);
    if (lVar4 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::enum_code_(kratos::Stream&,kratos::Enum*,bool)::__0>>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )uVar10,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )0x0,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:1195:43)>
                  )&local_38);
    }
    else {
      __last._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar10 + 0x200);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::enum_code_(kratos::Stream&,kratos::Enum*,bool)::__0>>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )uVar10,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:1195:43)>
                  )&local_38);
      if (__last._M_current !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        do {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<kratos::SystemVerilogCodeGen::enum_code_(kratos::Stream&,kratos::Enum*,bool)::__0>>
                    (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:1195:43)>
                             )&local_38);
          __last._M_current = __last._M_current + 1;
        } while (__last._M_current !=
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  pEVar5 = local_38;
  if (logic_str.field_2._8_8_ != 0) {
    this = &local_38->values;
    sVar12 = 1;
    uVar10 = logic_str.field_2._8_8_;
    do {
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>_>_>_>
               ::at(this,(key_type *)uVar10);
      if ((char)local_44 != '\0') {
        (((pmVar9->super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_Const).super_Var.super_IRNode.verilog_ln =
             *(uint32_t *)&(local_40->super_stringstream).field_0x90;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"  ",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(((key_type *)uVar10)->_M_dataplus)._M_p,
                          ((key_type *)uVar10)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
      Const::to_string_abi_cxx11_
                (&local_68,
                 &((pmVar9->super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_Const);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,local_68._M_dataplus._M_p,local_68._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((pEVar5->values)._M_t._M_impl.super__Rb_tree_header._M_node_count != sVar12) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,",",1);
      }
      puVar2 = &(local_40->super_stringstream).field_0x90;
      *(long *)puVar2 = *(long *)puVar2 + 1;
      local_68._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,(char *)&local_68,1);
      uVar10 = uVar10 + 0x20;
      sVar12 = (size_t)((int)sVar12 + 1);
    } while ((key_type *)uVar10 != (key_type *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"} ",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(local_38->name)._M_dataplus._M_p,
                      (local_38->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
  puVar1 = &(local_40->super_stringstream).field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  local_68._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_68,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&logic_str.field_2 + 8));
  if (local_a8 != (undefined1  [8])&logic_str._M_string_length) {
    operator_delete((void *)local_a8,logic_str._M_string_length + 1);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::enum_code_(kratos::Stream& stream_, kratos::Enum* enum_, bool debug) {
    std::string logic_str = enum_->width() == 1 ? "" : ::format("[{0}:0]", enum_->width() - 1);
    stream_ << "typedef enum logic" << logic_str << " {" << stream_.endl();
    uint32_t count = 0;
    const auto* const indent = "  ";
    // sort it by the values
    std::vector<std::string> names;
    names.reserve(enum_->values.size());
    for (auto const& iter : enum_->values) names.emplace_back(iter.first);
    std::sort(names.begin(), names.end(), [&](const auto& a, const auto& b) {
        return enum_->values.at(a)->value() < enum_->values.at(b)->value();
    });
    for (auto const& name : names) {
        auto& c = enum_->values.at(name);
        if (debug) {
            c->verilog_ln = stream_.line_no();
        }
        stream_ << indent << name << " = " << c->value_string();
        if (++count != enum_->values.size()) stream_ << ",";
        stream_ << stream_.endl();
    }
    stream_ << "} " << enum_->name << ";" << stream_.endl();
}